

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall Tracker::end(Tracker *this,string *_track)

{
  bool bVar1;
  mapped_type *pmVar2;
  rep rVar3;
  undefined1 local_68 [8];
  StatSample stat;
  duration<long,_std::ratio<1L,_1000000L>_> local_48;
  duration end;
  duration<long,_std::ratio<1L,_1000000L>_> local_38;
  duration start;
  _Self local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point sample_end;
  string *_track_local;
  Tracker *this_local;
  
  if ((this->m_running & 1U) != 0) {
    sample_end.__d.__r = (duration)(duration)_track;
    local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
         ::find(&this->m_data,(key_type *)sample_end.__d.__r);
    start.__r = (rep)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
                     ::end(&this->m_data);
    bVar1 = std::operator==(&local_28,(_Self *)&start);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_tracks,(value_type *)sample_end.__d.__r);
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
             ::operator[](&this->m_data,(key_type *)sample_end.__d.__r);
    end.__r = (rep)std::chrono::
                   time_point_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                             (&pmVar2->start);
    local_38.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                        ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                                            *)&end);
    stat.durationMs =
         (double)std::chrono::
                 time_point_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                           (&local_20);
    local_48.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                        ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                                            *)&stat.durationMs);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_38);
    local_68 = (undefined1  [8])((double)rVar3 * 0.001 + -this->m_trackerStart);
    rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_48);
    stat.startMs = (double)rVar3 * 0.001 + -this->m_trackerStart;
    stat.endMs = stat.startMs - (double)local_68;
    if (0.0 < (double)local_68) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
               ::operator[](&this->m_data,(key_type *)sample_end.__d.__r);
      std::vector<StatSample,_std::allocator<StatSample>_>::push_back
                (&pmVar2->samples,(value_type *)local_68);
    }
  }
  return;
}

Assistant:

void Tracker::end(const std::string& _track) {
    if (!m_running)
        return;

    auto sample_end = std::chrono::high_resolution_clock::now();

    if ( m_data.find(_track) == m_data.end() )
        m_tracks.push_back(_track);

    auto start = std::chrono::time_point_cast<std::chrono::microseconds>(m_data[_track].start).time_since_epoch();
    auto end = std::chrono::time_point_cast<std::chrono::microseconds>(sample_end).time_since_epoch();
    
    StatSample stat;
    stat.startMs = start.count() * 0.001 - m_trackerStart;
    stat.endMs = end.count() * 0.001 - m_trackerStart;
    stat.durationMs = stat.endMs - stat.startMs;

    if (stat.startMs > 0)
        m_data[_track].samples.push_back( stat );
}